

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O0

bool testing::internal::
     TypeParameterizedTest<NumericArgTest,_testing::internal::TemplateSel<NumericArgTest_MakeAndVisit_Test>,_testing::internal::Types13<signed_char,_unsigned_char,_int,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_long_long,_unsigned_long_long,_float,_double,_long_double>_>
     ::Register(char *prefix,char *case_name,char *test_names,int index)

{
  bool bVar1;
  undefined4 in_ECX;
  char *in_RDX;
  char *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  TestFactoryImpl<NumericArgTest_MakeAndVisit_Test<signed_char>_> *in_stack_fffffffffffffe80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe88;
  int *in_stack_fffffffffffffea8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffeb0;
  char *in_stack_fffffffffffffec8;
  string local_118 [32];
  SetUpTestCaseFunc in_stack_ffffffffffffff08;
  TypeId in_stack_ffffffffffffff10;
  char *in_stack_ffffffffffffff18;
  char *in_stack_ffffffffffffff20;
  char *in_stack_ffffffffffffff28;
  char *in_stack_ffffffffffffff30;
  allocator local_c1;
  TearDownTestCaseFunc in_stack_ffffffffffffff40;
  TestFactoryBase *in_stack_ffffffffffffff48;
  string local_a0 [32];
  string local_80 [32];
  string local_60 [32];
  string local_40 [28];
  int in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&stack0xffffffffffffff40,(char *)in_RDI,&local_c1);
  std::operator+(in_stack_fffffffffffffe88,(char *)in_stack_fffffffffffffe80);
  std::operator+(in_stack_fffffffffffffe88,(char *)in_stack_fffffffffffffe80);
  std::operator+(in_stack_fffffffffffffe88,(char *)in_stack_fffffffffffffe80);
  StreamableToString<int>(in_stack_fffffffffffffea8);
  std::operator+(in_RDI,in_stack_fffffffffffffeb0);
  std::__cxx11::string::c_str();
  GetPrefixUntilComma_abi_cxx11_(in_stack_fffffffffffffec8);
  std::__cxx11::string::c_str();
  GetTypeName<signed_char>();
  std::__cxx11::string::c_str();
  GetTypeId<NumericArgTest<signed_char>>();
  operator_new(8);
  TestFactoryImpl<NumericArgTest_MakeAndVisit_Test<signed_char>_>::TestFactoryImpl
            (in_stack_fffffffffffffe80);
  MakeAndRegisterTestInfo
            (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
             in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
             in_stack_ffffffffffffff40,in_stack_ffffffffffffff48);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffec8);
  std::__cxx11::string::~string(local_118);
  std::__cxx11::string::~string(local_40);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff08);
  std::__cxx11::string::~string(local_60);
  std::__cxx11::string::~string(local_80);
  std::__cxx11::string::~string(local_a0);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff40);
  std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  bVar1 = TypeParameterizedTest<NumericArgTest,_testing::internal::TemplateSel<NumericArgTest_MakeAndVisit_Test>,_testing::internal::Types12<unsigned_char,_int,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_long_long,_unsigned_long_long,_float,_double,_long_double>_>
          ::Register(in_RSI,in_RDX,(char *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),
                     in_stack_ffffffffffffffdc);
  return bVar1;
}

Assistant:

static bool Register(const char* prefix, const char* case_name,
                       const char* test_names, int index) {
    typedef typename Types::Head Type;
    typedef Fixture<Type> FixtureClass;
    typedef typename GTEST_BIND_(TestSel, Type) TestClass;

    // First, registers the first type-parameterized test in the type
    // list.
    MakeAndRegisterTestInfo(
        (std::string(prefix) + (prefix[0] == '\0' ? "" : "/") + case_name + "/"
         + StreamableToString(index)).c_str(),
        GetPrefixUntilComma(test_names).c_str(),
        GetTypeName<Type>().c_str(),
        NULL,  // No value parameter.
        GetTypeId<FixtureClass>(),
        TestClass::SetUpTestCase,
        TestClass::TearDownTestCase,
        new TestFactoryImpl<TestClass>);

    // Next, recurses (at compile time) with the tail of the type list.
    return TypeParameterizedTest<Fixture, TestSel, typename Types::Tail>
        ::Register(prefix, case_name, test_names, index + 1);
  }